

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  pointer pcVar1;
  string *psVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string hg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_identify;
  OutputLogger err;
  IdentifyParser out;
  string local_340;
  long *local_320;
  long local_318;
  long local_310 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  OutputLogger local_2e8;
  undefined1 local_2a8 [32];
  char *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  string *local_268 [2];
  string local_258 [16];
  char *local_40;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_2a8._0_8_ = local_2a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_320,local_318 + (long)local_320);
  local_288 = local_280._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"identify","");
  psVar2 = local_258;
  local_268[0] = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"-i","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_2a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_300,__l,(allocator_type *)&local_2e8);
  lVar3 = -0x60;
  do {
    if (psVar2 != (string *)psVar2[-1].field_2._M_allocated_capacity) {
      operator_delete((string *)psVar2[-1].field_2._M_allocated_capacity,
                      (ulong)((psVar2->_M_dataplus)._M_p + 1));
    }
    psVar2 = psVar2 + -1;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  IdentifyParser::IdentifyParser
            ((IdentifyParser *)local_2a8,this,"rev-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_2e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-err> ");
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_300,(OutputParser *)local_2a8,
                      (OutputParser *)&local_2e8,&local_340,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                             local_340.field_2._M_local_buf[0]) + 1);
  }
  local_2e8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.super_LineParser.Line._M_dataplus._M_p !=
      &local_2e8.super_LineParser.Line.field_2) {
    operator_delete(local_2e8.super_LineParser.Line._M_dataplus._M_p,
                    local_2e8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_2a8._0_8_ = &PTR__IdentifyParser_00b17cc8;
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  local_2a8._0_8_ = &PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._24_8_ != &local_280) {
    operator_delete((void *)local_2a8._24_8_,local_280._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_300);
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  std::string hg = this->CommandLineTool;
  std::vector<std::string> hg_identify = { hg, "identify", "-i" };
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}